

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void CVmObjGramProd::build_match_tree
               (CVmGramProdMatch *match,vm_val_t *toklist,vm_val_t *tokmatchlist,vm_val_t *retval,
               size_t *first_tok,size_t *last_tok)

{
  size_t sVar1;
  vm_obj_id_t obj;
  int idx;
  vm_val_t *pvVar2;
  CVmObject *idx_00;
  vm_val_t *in_RCX;
  vm_val_t *in_RDX;
  CVmGramProdMatch *in_RSI;
  long in_RDI;
  vm_val_t *in_R8;
  size_t *in_R9;
  CVmObjList *match_lst;
  vm_val_t ele_val;
  int lstcnt;
  vm_val_t val_1;
  vm_val_t val;
  size_t last_sub_tok;
  size_t first_sub_tok;
  size_t i;
  CVmObjTads *objp;
  vm_obj_id_t obj_id;
  undefined8 in_stack_ffffffffffffff68;
  uint argc;
  CVmObjList *in_stack_ffffffffffffff70;
  vm_val_t *in_stack_ffffffffffffff78;
  vm_val_t *in_stack_ffffffffffffff88;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff90;
  undefined1 local_68 [16];
  ulong local_58;
  ulong local_50;
  ulong local_48;
  CVmObject *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  
  argc = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (*(int *)(in_RDI + 0x24) == 0) {
    idx = vm_val_t::ll_length(in_stack_ffffffffffffff78);
    if ((int)*(undefined8 *)(in_RDI + 8) < idx) {
      vm_val_t::ll_index((vm_val_t *)in_stack_ffffffffffffff90.native_desc,in_stack_ffffffffffffff88
                         ,idx);
      vm_val_t::ll_index((vm_val_t *)in_stack_ffffffffffffff90.native_desc,in_stack_ffffffffffffff88
                         ,idx);
      if (*(int *)(in_RDI + 0x20) == 0) {
        idx_00 = vm_objp(0);
        CVmObjList::cons_set_element(in_stack_ffffffffffffff70,(size_t)idx_00,(vm_val_t *)0x30545b);
      }
    }
    else {
      vm_val_t::set_nil(in_RCX);
    }
    if (*(int *)(in_RDI + 0x20) == 0) {
      sVar1 = *(size_t *)(in_RDI + 8);
      *in_R9 = sVar1;
      *(size_t *)in_R8 = sVar1;
    }
  }
  else {
    pvVar2 = CVmStack::push();
    vm_val_t::set_obj(pvVar2,*(vm_obj_id_t *)(in_RDI + 0x24));
    obj = CVmObjTads::create_from_stack((uchar **)in_stack_ffffffffffffff70,argc);
    local_40 = vm_objp(0);
    pvVar2 = CVmStack::push();
    vm_val_t::set_obj(pvVar2,obj);
    *(size_t *)in_R8 = *(long *)(in_RDI + 8) + 1;
    *in_R9 = *(size_t *)(in_RDI + 8);
    for (local_48 = 0; local_48 < *(ulong *)(in_RDI + 0x30); local_48 = local_48 + 1) {
      build_match_tree(in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                       (size_t *)CONCAT44(obj,in_stack_ffffffffffffffc8));
      if (local_48 == 0) {
        *(ulong *)in_R8 = local_50;
        *in_R9 = local_58;
      }
      else if (local_50 <= local_58) {
        if (local_50 < *(ulong *)in_R8) {
          *(ulong *)in_R8 = local_50;
        }
        if (*in_R9 < local_58) {
          *in_R9 = local_58;
        }
      }
      if (**(short **)(*(long *)(in_RDI + 0x28) + local_48 * 8) != 0) {
        (*local_40->_vptr_CVmObject[0xc])
                  (local_40,0,(ulong)obj,
                   (ulong)**(ushort **)(*(long *)(in_RDI + 0x28) + local_48 * 8),local_68);
      }
    }
    if ((G_predef_X.gramprod_first_tok != 0) && (G_predef_X.gramprod_last_tok != 0)) {
      vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffff88,(int)*(undefined8 *)in_R8 + 1);
      (*local_40->_vptr_CVmObject[0xc])
                (local_40,0,(ulong)obj,(ulong)G_predef_X.gramprod_first_tok,&stack0xffffffffffffff88
                );
      vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffff88,(int)*in_R9 + 1);
      (*local_40->_vptr_CVmObject[0xc])
                (local_40,0,(ulong)obj,(ulong)G_predef_X.gramprod_last_tok,&stack0xffffffffffffff88)
      ;
    }
    if (G_predef_X.gramprod_token_list != 0) {
      (*local_40->_vptr_CVmObject[0xc])
                (local_40,0,(ulong)obj,(ulong)G_predef_X.gramprod_token_list,in_RSI);
    }
    if (G_predef_X.gramprod_token_match_list != 0) {
      (*local_40->_vptr_CVmObject[0xc])
                (local_40,0,(ulong)obj,(ulong)G_predef_X.gramprod_token_match_list,in_RDX);
    }
    CVmStack::discard();
    vm_val_t::set_obj(in_RCX,obj);
  }
  return;
}

Assistant:

void CVmObjGramProd::build_match_tree(VMG_ const CVmGramProdMatch *match,
                                      const vm_val_t *toklist,
                                      const vm_val_t *tokmatchlist,
                                      vm_val_t *retval,
                                      size_t *first_tok, size_t *last_tok)
{
    /* check to see what kind of match we have */
    if (match->proc_obj_ != VM_INVALID_OBJ)
    {
        vm_obj_id_t obj_id;
        CVmObjTads *objp;
        size_t i;

        /* 
         *   Create the object to hold the current tree level.  The only
         *   constructor argument is the superclass, which is the match's
         *   processor object. 
         */
        G_stk->push()->set_obj(match->proc_obj_);
        obj_id = CVmObjTads::create_from_stack(vmg_ 0, 1);

        /* get a pointer to the new object */
        objp = (CVmObjTads *)vm_objp(vmg_ obj_id);

        /* push this object to protect it from gc for a moment */
        G_stk->push()->set_obj(obj_id);

        /* 
         *   Initialize the caller's first/last token indices to an invalid
         *   range, in case we have no subproductions.  A production with no
         *   tokens and no subproductions matches no tokens at all; we
         *   indicate this by using an invalid range, with the first token
         *   index higher than the last token index.  Note that it's still
         *   important that we accurately reflect the end of our range for a
         *   zero-token match, since our enclosing nodes will need our
         *   position to figure out where they go.  
         */
        *first_tok = match->tok_pos_ + 1;
        *last_tok = match->tok_pos_;

        /* build the sub-match entries */
        for (i = 0 ; i < match->sub_match_cnt_ ; ++i)
        {
            size_t first_sub_tok;
            size_t last_sub_tok;
            vm_val_t val;

            /* build this subtree */
            build_match_tree(vmg_ match->sub_match_list_[i],
                             toklist, tokmatchlist,
                             &val, &first_sub_tok, &last_sub_tok);

            /* 
             *   If this is the first subtree, use it as the tentative
             *   limits for our overall match so far; otherwise, expand our
             *   limits if they are outside our range so far.
             *   
             *   If the submatch doesn't include any tokens, it obviously
             *   has no effect on our range.  The submatch range will
             *   indicate that the first token index is greater than the
             *   last token index if the submatch includes no tokens.  
             */
            if (i == 0)
            {
                /* it's the first subtree - it's all we know as yet */
                *first_tok = first_sub_tok;
                *last_tok = last_sub_tok;
            }
            else if (first_sub_tok <= last_sub_tok)
            {
                /* check to see if it expands our current range */
                if (first_sub_tok < *first_tok)
                    *first_tok = first_sub_tok;
                if (last_sub_tok > *last_tok)
                    *last_tok = last_sub_tok;
            }

            /* 
             *   save the subtree with the current match object if there's a
             *   property in which to save it 
             */
            if (match->sub_match_list_[i]->target_prop_ != VM_INVALID_PROP)
            {
                /* 
                 *   Set the processor object property for the value.  Note
                 *   that we don't have to keep undo for this change, since
                 *   we just created the tree object ourselves, and we don't
                 *   create any undo savepoints - an object created after
                 *   the most recent undo savepoint doesn't need to keep
                 *   undo information, since the entire object will be
                 *   deleted if we undo to the savepoint. 
                 */
                objp->set_prop(vmg_ 0, obj_id,
                               match->sub_match_list_[i]->target_prop_,
                               &val);
            }
        }

        /* 
         *   if we have exported properties for recording the token index
         *   range, save them with the object 
         */
        if (G_predef->gramprod_first_tok != VM_INVALID_PROP
            && G_predef->gramprod_last_tok != VM_INVALID_PROP)
        {
            vm_val_t val;

            /* save the first token index */
            val.set_int((int)*first_tok + 1);
            objp->set_prop(vmg_ 0, obj_id,
                           G_predef->gramprod_first_tok, &val);

            /* save the last token index */
            val.set_int((int)*last_tok + 1);
            objp->set_prop(vmg_ 0, obj_id,
                           G_predef->gramprod_last_tok, &val);
        }

        /* 
         *   if we have the token list property exported, set it to the
         *   original token list reference 
         */
        if (G_predef->gramprod_token_list != VM_INVALID_PROP)
        {
            /* save the token list reference */
            objp->set_prop(vmg_ 0, obj_id,
                           G_predef->gramprod_token_list, toklist);
        }

        /* if we have the token match list property exported, set it */
        if (G_predef->gramprod_token_match_list != VM_INVALID_PROP)
        {
            /* save the token match list reference */
            objp->set_prop(vmg_ 0, obj_id,
                           G_predef->gramprod_token_match_list, tokmatchlist);
        }

        /* discard our gc protection */
        G_stk->discard();

        /* the return value is the object */
        retval->set_obj(obj_id);
    }
    else
    {
        /* get the token list */
        int lstcnt = toklist->ll_length(vmg0_);

        /* make sure the index is in range */
        if ((int)match->tok_pos_ < lstcnt)
        {
            vm_val_t ele_val;
            CVmObjList *match_lst;
            
            /* get the token from the list */
            toklist->ll_index(vmg_ &ele_val, match->tok_pos_ + 1);

            /* 
             *   the token is itself a list, whose first element is the
             *   token's value - retrieve the value 
             */
            ele_val.ll_index(vmg_ retval, 1);

            /* 
             *   Store the token match result in the result list.  If this is
             *   a '*' match, it doesn't have a result list contribution,
             *   because '*' doesn't actually match any tokens (it merely
             *   stops parsing). 
             */
            if (!match->matched_star_)
            {
                /* get the match list */
                match_lst = (CVmObjList *)vm_objp(vmg_ tokmatchlist->val.obj);

                /* 
                 *   set the element at this token position in the match list
                 *   to the token match result 
                 */
                match_lst->cons_set_element(
                    match->tok_pos_, &match->tok_match_result_);
            }
        }
        else
        {
            /* 
             *   the index is past the end of the list - this must be a
             *   '*' token that matched nothing (i.e., the token list was
             *   fully consumed before we reached the '*'), so just return
             *   nil for the match value 
             */
            retval->set_nil();
        }

        /* 
         *   We match one token, so it's the first and last index.  Note
         *   that if this is a '*' match, we don't match any tokens.  
         */
        if (!match->matched_star_)
            *first_tok = *last_tok = match->tok_pos_;
    }
}